

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t icu_63::UnicodeSet::matchRest
                  (Replaceable *text,int32_t start,int32_t limit,UnicodeString *s)

{
  char16_t cVar1;
  char16_t cVar2;
  int32_t iVar3;
  int local_30;
  int32_t slen;
  int32_t maxLen;
  int32_t i;
  UnicodeString *s_local;
  int32_t limit_local;
  int32_t start_local;
  Replaceable *text_local;
  
  iVar3 = UnicodeString::length(s);
  if (start < limit) {
    local_30 = limit - start;
    if (iVar3 < limit - start) {
      local_30 = iVar3;
    }
    for (slen = 1; slen < local_30; slen = slen + 1) {
      cVar1 = Replaceable::charAt(text,start + slen);
      cVar2 = UnicodeString::charAt(s,slen);
      if (cVar1 != cVar2) {
        return 0;
      }
    }
  }
  else {
    local_30 = start - limit;
    if (iVar3 < start - limit) {
      local_30 = iVar3;
    }
    for (slen = 1; slen < local_30; slen = slen + 1) {
      cVar1 = Replaceable::charAt(text,start - slen);
      cVar2 = UnicodeString::charAt(s,(iVar3 + -1) - slen);
      if (cVar1 != cVar2) {
        return 0;
      }
    }
  }
  return local_30;
}

Assistant:

int32_t UnicodeSet::matchRest(const Replaceable& text,
                              int32_t start, int32_t limit,
                              const UnicodeString& s) {
    int32_t i;
    int32_t maxLen;
    int32_t slen = s.length();
    if (start < limit) {
        maxLen = limit - start;
        if (maxLen > slen) maxLen = slen;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start + i) != s.charAt(i)) return 0;
        }
    } else {
        maxLen = start - limit;
        if (maxLen > slen) maxLen = slen;
        --slen; // <=> slen = s.length() - 1;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start - i) != s.charAt(slen - i)) return 0;
        }
    }
    return maxLen;
}